

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::ReadBuffersResponse::ParseFromArray
          (ReadBuffersResponse *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pRVar2;
  pointer pRVar3;
  bool bVar4;
  short sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  uint8_t cur_byte_2;
  ulong uVar12;
  uint8_t cur_byte_3;
  uint8_t cur_byte;
  ulong *puVar13;
  uint8_t cur_byte_1;
  pointer pRVar14;
  Field local_48;
  vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
  *local_38;
  
  pRVar2 = (this->slices_).
           super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->slices_).
           super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar14 = pRVar2;
  if (pRVar3 != pRVar2) {
    do {
      (**(pRVar14->super_CppMessageObj)._vptr_CppMessageObj)(pRVar14);
      pRVar14 = pRVar14 + 1;
    } while (pRVar14 != pRVar3);
    (this->slices_).
    super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  }
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->slices_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_0024f3e4_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar11 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_0024f3e4_caseD_3;
        uVar6 = *puVar11;
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar8 >> 3;
    if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_0024f3e4_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar10 = 0;
      uVar12 = 0;
      while( true ) {
        puVar13 = (ulong *)((long)puVar11 + 1);
        uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
        if (-1 < (char)(byte)*puVar11) break;
        if ((puVar9 <= puVar13) ||
           (bVar4 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar4))
        goto switchD_0024f3e4_caseD_3;
      }
      local_48.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 1:
      puVar13 = puVar11 + 1;
      if (puVar9 < puVar13) goto switchD_0024f3e4_caseD_3;
      uVar10 = *puVar11;
      local_48.int_value_ = uVar10 & 0xffffffff00000000;
      break;
    case 2:
      puVar11 = (ulong *)((long)puVar11 + 1);
      uVar12 = 0;
      uVar10 = 0;
      puVar13 = puVar11;
      while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                      uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
        if (puVar9 <= puVar13) goto switchD_0024f3e4_caseD_3;
        puVar13 = (ulong *)((long)puVar13 + 1);
        puVar11 = (ulong *)((long)puVar11 + 1);
        bVar4 = 0x38 < uVar10;
        uVar10 = uVar10 + 7;
        if (bVar4) goto switchD_0024f3e4_caseD_3;
      }
      if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
        local_48.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
        puVar13 = (ulong *)((long)puVar13 + uVar12);
        uVar10 = (ulong)puVar11 & 0xffffffff;
        goto LAB_0024f4bf;
      }
    default:
      goto switchD_0024f3e4_caseD_3;
    case 5:
      puVar13 = (ulong *)((long)puVar11 + 4);
      if (puVar9 < puVar13) goto switchD_0024f3e4_caseD_3;
      uVar10 = (ulong)(uint)*puVar11;
      local_48.int_value_ = 0;
    }
    uVar12 = 0;
LAB_0024f4bf:
    raw = puVar13;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
  local_48.int_value_ = local_48.int_value_ | uVar10 & 0xffffffff;
  uVar10 = uVar6 << 0x20 | uVar12;
  local_48.type_ = (byte)(uVar10 >> 0x30) | (byte)uVar8 & 7;
  local_48.size_ = (uint32_t)uVar12;
  local_48.id_ = (uint16_t)(uVar10 >> 0x20);
  sVar5 = (short)uVar6;
  while (sVar5 != 0) {
    if (((ushort)uVar6 < 3) &&
       ((this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f),
       (ushort)uVar6 == 2)) {
      std::
      vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
      ::emplace_back<>(local_38);
      pRVar2 = (this->slices_).
               super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (*pRVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                (pRVar2 + -1,local_48.int_value_,(ulong)local_48.size_);
    }
    else {
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                (&local_48,&this->unknown_fields_);
    }
    do {
      if (puVar9 <= raw) goto switchD_0024f3e4_caseD_3;
      bVar1 = (byte)*raw;
      uVar8 = (ulong)bVar1;
      puVar11 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar9 <= puVar11) || (0x38 < lVar7 - 7U)) goto switchD_0024f3e4_caseD_3;
          uVar6 = *puVar11;
          puVar11 = (ulong *)((long)puVar11 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar6 < '\0');
      }
      uVar6 = uVar8 >> 3;
      if (((uint)uVar6 == 0) || (puVar9 <= puVar11)) goto switchD_0024f3e4_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar10 = 0;
        uVar12 = 0;
        while( true ) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar10 = (ulong)((byte)*puVar11 & 0x7f) << ((byte)uVar12 & 0x3f) | uVar10;
          if (-1 < (char)(byte)*puVar11) break;
          if ((puVar9 <= puVar13) ||
             (bVar4 = 0x38 < uVar12, uVar12 = uVar12 + 7, puVar11 = puVar13, bVar4))
          goto switchD_0024f3e4_caseD_3;
        }
        local_48.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 1:
        puVar13 = puVar11 + 1;
        if (puVar9 < puVar13) goto switchD_0024f3e4_caseD_3;
        uVar10 = *puVar11;
        local_48.int_value_ = uVar10 & 0xffffffff00000000;
        break;
      case 2:
        puVar11 = (ulong *)((long)puVar11 + 1);
        uVar12 = 0;
        uVar10 = 0;
        puVar13 = puVar11;
        while (uVar12 = (ulong)(*(byte *)((long)puVar13 + -1) & 0x7f) << ((byte)uVar10 & 0x3f) |
                        uVar12, (char)*(byte *)((long)puVar13 + -1) < '\0') {
          if (puVar9 <= puVar13) goto switchD_0024f3e4_caseD_3;
          puVar13 = (ulong *)((long)puVar13 + 1);
          puVar11 = (ulong *)((long)puVar11 + 1);
          bVar4 = 0x38 < uVar10;
          uVar10 = uVar10 + 7;
          if (bVar4) goto switchD_0024f3e4_caseD_3;
        }
        if (uVar12 <= (ulong)((long)puVar9 - (long)puVar11)) {
          local_48.int_value_ = (ulong)puVar11 & 0xffffffff00000000;
          puVar13 = (ulong *)((long)puVar13 + uVar12);
          uVar10 = (ulong)puVar11 & 0xffffffff;
          goto LAB_0024f6f3;
        }
      default:
        goto switchD_0024f3e4_caseD_3;
      case 5:
        puVar13 = (ulong *)((long)puVar11 + 4);
        if (puVar9 < puVar13) goto switchD_0024f3e4_caseD_3;
        uVar10 = (ulong)(uint)*puVar11;
        local_48.int_value_ = 0;
      }
      uVar12 = 0;
LAB_0024f6f3:
      raw = puVar13;
    } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar12));
    local_48.int_value_ = local_48.int_value_ | uVar10 & 0xffffffff;
    uVar10 = uVar6 << 0x20 | uVar12;
    local_48.type_ = (byte)(uVar10 >> 0x30) | (byte)uVar8 & 7;
    local_48.size_ = (uint32_t)uVar12;
    local_48.id_ = (uint16_t)(uVar10 >> 0x20);
    sVar5 = (short)uVar6;
  }
switchD_0024f3e4_caseD_3:
  return puVar9 == (ulong *)raw;
}

Assistant:

bool ReadBuffersResponse::ParseFromArray(const void* raw, size_t size) {
  slices_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 2 /* slices */:
        slices_.emplace_back();
        slices_.back().ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}